

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O2

void __thiscall duckdb::ZSTDCompressionState::AddString(ZSTDCompressionState *this,string_t *string)

{
  idx_t iVar1;
  pointer pCVar2;
  
  iVar1 = this->tuple_count;
  if (iVar1 == 0) {
    InitializeVector(this);
    iVar1 = this->tuple_count;
  }
  this->string_lengths[iVar1] = (string->value).pointer.length;
  CompressString(this,string,this->vector_size <= iVar1 + 1);
  iVar1 = this->tuple_count + 1;
  this->tuple_count = iVar1;
  if (iVar1 == this->vector_size) {
    FlushVector(this);
  }
  pCVar2 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->segment);
  StringStats::Update(&(pCVar2->stats).statistics,string);
  return;
}

Assistant:

void AddString(const string_t &string) {
		if (!tuple_count) {
			InitializeVector();
		}

		string_lengths[tuple_count] = UnsafeNumericCast<string_length_t>(string.GetSize());
		bool final_tuple = tuple_count + 1 >= vector_size;
		CompressString(string, final_tuple);

		tuple_count++;
		if (tuple_count == vector_size) {
			// Reached the end of this vector
			FlushVector();
		}

		UncompressedStringStorage::UpdateStringStats(segment->stats, string);
	}